

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.h
# Opt level: O1

QDataStream *
QtPrivate::writeSequentialContainer<QList<QHeaderViewPrivate::SectionItem>>
          (QDataStream *s,QList<QHeaderViewPrivate::SectionItem> *c)

{
  ulong uVar1;
  QDataStream *this;
  int iVar2;
  value_type *t;
  SectionItem *section;
  long lVar3;
  
  uVar1 = (c->d).size;
  if (uVar1 >> 1 < 0x7fffffff) {
    iVar2 = (int)uVar1;
  }
  else {
    if (0x15 < *(int *)(s + 0x18)) {
      this = (QDataStream *)QDataStream::operator<<(s,-2);
      QDataStream::operator<<(this,uVar1);
      goto LAB_005615d5;
    }
    if (uVar1 != 0xfffffffe) {
      QDataStream::setStatus((Status)s);
      return s;
    }
    iVar2 = -2;
  }
  QDataStream::operator<<(s,iVar2);
LAB_005615d5:
  lVar3 = (c->d).size;
  if (lVar3 != 0) {
    section = (c->d).ptr;
    lVar3 = lVar3 << 3;
    do {
      ::operator<<(s,section);
      section = section + 1;
      lVar3 = lVar3 + -8;
    } while (lVar3 != 0);
  }
  return s;
}

Assistant:

QDataStream &writeSequentialContainer(QDataStream &s, const Container &c)
{
    if (!QDataStream::writeQSizeType(s, c.size()))
        return s;
    for (const typename Container::value_type &t : c)
        s << t;

    return s;
}